

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_address.cpp
# Opt level: O0

int CfdGetPeginAddress(void *handle,int mainchain_network_type,char *fedpeg_script,int hash_type,
                      char *pubkey,char *redeem_script,char **pegin_address,char **claim_script,
                      char **tweaked_fedpeg_script)

{
  bool bVar1;
  undefined8 uVar2;
  char *in_RDX;
  string *in_R8;
  char *in_R9;
  undefined8 *in_stack_00000008;
  undefined8 *in_stack_00000010;
  undefined8 *in_stack_00000018;
  CfdException *except;
  exception *std_except;
  Address addr;
  Script tweak_fedpegscript;
  Script claim_script_obj;
  AddressType addr_type;
  NetType net_type;
  bool is_bitcoin;
  char *work_fedpeg_script;
  char *work_script;
  char *work_address;
  int result;
  Address *in_stack_fffffffffffff990;
  string *in_stack_fffffffffffff9a0;
  undefined8 in_stack_fffffffffffff9a8;
  CfdError error_code;
  CfdException *in_stack_fffffffffffff9b0;
  undefined6 in_stack_fffffffffffff9e8;
  undefined1 in_stack_fffffffffffff9ee;
  undefined1 in_stack_fffffffffffff9ef;
  string *in_stack_fffffffffffff9f0;
  bool local_5fd;
  Script *in_stack_fffffffffffffa20;
  undefined8 in_stack_fffffffffffffa28;
  allocator *paVar3;
  string local_588;
  string local_568;
  string local_548;
  Address local_528;
  allocator local_3a9;
  string local_3a8;
  Script local_388;
  Script local_350;
  allocator local_311;
  string local_310;
  Script local_2f0;
  Script local_2b8;
  allocator local_279;
  string local_278;
  Pubkey local_258;
  Script local_240;
  byte local_204;
  byte local_203;
  byte local_202;
  allocator local_201;
  string local_200;
  ByteData local_1e0;
  Script local_1c8;
  AddressType local_190;
  undefined1 local_18a;
  allocator local_189;
  string local_188 [32];
  NetType local_168;
  byte local_163;
  undefined1 local_162;
  allocator local_161;
  string local_160 [32];
  CfdSourceLocation local_140;
  undefined1 local_122;
  allocator local_121;
  string local_120 [32];
  CfdSourceLocation local_100;
  undefined1 local_e2;
  allocator local_e1;
  string local_e0 [32];
  CfdSourceLocation local_c0;
  undefined1 local_a2;
  allocator local_a1;
  string local_a0 [32];
  CfdSourceLocation local_80;
  char *local_58;
  char *local_50;
  char *local_48;
  undefined4 local_3c;
  char *local_38;
  string *local_30;
  char *local_20;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffff9a8 >> 0x20);
  local_3c = 0xffffffff;
  local_48 = (char *)0x0;
  local_50 = (char *)0x0;
  local_58 = (char *)0x0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_20 = in_RDX;
  cfd::Initialize();
  if (in_stack_00000008 == (undefined8 *)0x0) {
    local_80.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_address.cpp"
                 ,0x2f);
    local_80.filename = local_80.filename + 1;
    local_80.line = 0xaa;
    local_80.funcname = "CfdGetPeginAddress";
    cfd::core::logger::warn<>(&local_80,"pegin_address is null.");
    local_a2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"Failed to parameter. pegin_address is null.",&local_a1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffff9b0,error_code,in_stack_fffffffffffff9a0);
    local_a2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if ((local_30 == (string *)0x0) && (local_38 == (char *)0x0)) {
    local_c0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_address.cpp"
                 ,0x2f);
    local_c0.filename = local_c0.filename + 1;
    local_c0.line = 0xb0;
    local_c0.funcname = "CfdGetPeginAddress";
    cfd::core::logger::warn<>(&local_c0,"pubkey and script is null.");
    local_e2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_e0,"Failed to parameter. pubkey and script is null.",&local_e1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffff9b0,error_code,in_stack_fffffffffffff9a0);
    local_e2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (in_stack_00000010 == (undefined8 *)0x0) {
    local_100.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_address.cpp"
                 ,0x2f);
    local_100.filename = local_100.filename + 1;
    local_100.line = 0xb6;
    local_100.funcname = "CfdGetPeginAddress";
    cfd::core::logger::warn<>(&local_100,"claim_script is null.");
    local_122 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_120,"Failed to parameter. claim_script is null.",&local_121);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffff9b0,error_code,in_stack_fffffffffffff9a0);
    local_122 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (bVar1) {
    local_140.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_address.cpp"
                 ,0x2f);
    local_140.filename = local_140.filename + 1;
    local_140.line = 0xbc;
    local_140.funcname = "CfdGetPeginAddress";
    cfd::core::logger::warn<>(&local_140,"fedpeg_script is null or empty.");
    local_162 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    paVar3 = &local_161;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_160,"Failed to parameter. fedpeg_script is null or empty.",paVar3);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffff9b0,error_code,in_stack_fffffffffffff9a0);
    local_162 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_163 = 0;
  local_168 = cfd::capi::ConvertNetType
                        ((int)((ulong)in_stack_fffffffffffff9f0 >> 0x20),
                         (bool *)CONCAT17(in_stack_fffffffffffff9ef,
                                          CONCAT16(in_stack_fffffffffffff9ee,
                                                   in_stack_fffffffffffff9e8)));
  if ((local_163 & 1) != 0) {
    local_190 = cfd::capi::ConvertHashToAddressType((int)((ulong)in_stack_fffffffffffff9f0 >> 0x20))
    ;
    cfd::core::Script::Script(&local_1c8);
    local_202 = 0;
    local_203 = 0;
    local_204 = 0;
    local_5fd = false;
    if (local_30 != (string *)0x0) {
      in_stack_fffffffffffff9f0 = local_30;
      std::allocator<char>::allocator();
      local_202 = 1;
      std::__cxx11::string::string
                ((string *)&local_200,(char *)in_stack_fffffffffffff9f0,&local_201);
      local_203 = 1;
      cfd::core::ByteData::ByteData(&local_1e0,&local_200);
      local_204 = 1;
      local_5fd = cfd::core::Pubkey::IsValid(&local_1e0);
    }
    if ((local_204 & 1) != 0) {
      cfd::core::ByteData::~ByteData((ByteData *)0x5a1d4f);
    }
    if ((local_203 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_200);
    }
    if ((local_202 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_201);
    }
    if ((local_5fd & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_310,local_38,&local_311);
      cfd::core::Script::Script(&local_2f0,&local_310);
      cfd::core::ScriptUtil::CreateP2wshLockingScript(&local_2b8,&local_2f0);
      cfd::core::Script::operator=(&local_1c8,&local_2b8);
      cfd::core::Script::~Script((Script *)in_stack_fffffffffffff990);
      cfd::core::Script::~Script((Script *)in_stack_fffffffffffff990);
      std::__cxx11::string::~string((string *)&local_310);
      std::allocator<char>::~allocator((allocator<char> *)&local_311);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_278,(char *)local_30,&local_279);
      cfd::core::Pubkey::Pubkey(&local_258,&local_278);
      cfd::core::ScriptUtil::CreateP2wpkhLockingScript(&local_240,&local_258);
      cfd::core::Script::operator=(&local_1c8,&local_240);
      cfd::core::Script::~Script((Script *)in_stack_fffffffffffff990);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x5a1e25);
      std::__cxx11::string::~string((string *)&local_278);
      std::allocator<char>::~allocator((allocator<char> *)&local_279);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3a8,local_20,&local_3a9);
    cfd::core::Script::Script(&local_388,&local_3a8);
    cfd::core::ContractHashUtil::GetContractScript(&local_350,&local_1c8,&local_388);
    cfd::core::Script::~Script((Script *)in_stack_fffffffffffff990);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
    cfd::ElementsAddressFactory::CreatePegInAddress
              ((NetType)((ulong)in_stack_fffffffffffffa28 >> 0x20),
               (AddressType)in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
    cfd::core::Address::GetAddress_abi_cxx11_(&local_548,&local_528);
    local_48 = cfd::capi::CreateString(in_stack_fffffffffffff9f0);
    std::__cxx11::string::~string((string *)&local_548);
    cfd::core::Script::GetHex_abi_cxx11_(&local_568,&local_1c8);
    local_50 = cfd::capi::CreateString(in_stack_fffffffffffff9f0);
    std::__cxx11::string::~string((string *)&local_568);
    if (in_stack_00000018 != (undefined8 *)0x0) {
      cfd::core::Script::GetHex_abi_cxx11_(&local_588,&local_350);
      local_58 = cfd::capi::CreateString(in_stack_fffffffffffff9f0);
      std::__cxx11::string::~string((string *)&local_588);
    }
    *in_stack_00000008 = local_48;
    *in_stack_00000010 = local_50;
    if (in_stack_00000018 != (undefined8 *)0x0) {
      *in_stack_00000018 = local_58;
    }
    local_4 = 0;
    cfd::core::Address::~Address(in_stack_fffffffffffff990);
    cfd::core::Script::~Script((Script *)in_stack_fffffffffffff990);
    cfd::core::Script::~Script((Script *)in_stack_fffffffffffff990);
    return local_4;
  }
  local_18a = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_188,"Invalid network type. need mainchain network type.",&local_189);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffff9b0,error_code,in_stack_fffffffffffff9a0);
  local_18a = 0;
  __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetPeginAddress(
    void* handle, int mainchain_network_type, const char* fedpeg_script,
    int hash_type, const char* pubkey, const char* redeem_script,
    char** pegin_address, char** claim_script, char** tweaked_fedpeg_script) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_address = nullptr;
  char* work_script = nullptr;
  char* work_fedpeg_script = nullptr;
  try {
    cfd::Initialize();
    if (pegin_address == nullptr) {
      warn(CFD_LOG_SOURCE, "pegin_address is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pegin_address is null.");
    }
    if ((pubkey == nullptr) && (redeem_script == nullptr)) {
      warn(CFD_LOG_SOURCE, "pubkey and script is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey and script is null.");
    }
    if (claim_script == nullptr) {
      warn(CFD_LOG_SOURCE, "claim_script is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. claim_script is null.");
    }
    if (IsEmptyString(fedpeg_script)) {
      warn(CFD_LOG_SOURCE, "fedpeg_script is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. fedpeg_script is null or empty.");
    }

    bool is_bitcoin = false;
    auto net_type = ConvertNetType(mainchain_network_type, &is_bitcoin);
    if (!is_bitcoin) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Invalid network type. need mainchain network type.");
    }
    auto addr_type = ConvertHashToAddressType(hash_type);
    Script claim_script_obj;
    if ((pubkey != nullptr) && Pubkey::IsValid(ByteData(pubkey))) {
      claim_script_obj = ScriptUtil::CreateP2wpkhLockingScript(Pubkey(pubkey));
    } else {
      claim_script_obj =
          ScriptUtil::CreateP2wshLockingScript(Script(redeem_script));
    }

    Script tweak_fedpegscript = ContractHashUtil::GetContractScript(
        claim_script_obj, Script(fedpeg_script));
    auto addr = ElementsAddressFactory::CreatePegInAddress(
        net_type, addr_type, tweak_fedpegscript);

    work_address = CreateString(addr.GetAddress());
    work_script = CreateString(claim_script_obj.GetHex());
    if (tweaked_fedpeg_script != nullptr) {
      work_fedpeg_script = CreateString(tweak_fedpegscript.GetHex());
    }

    *pegin_address = work_address;
    *claim_script = work_script;
    if (tweaked_fedpeg_script != nullptr) {
      *tweaked_fedpeg_script = work_fedpeg_script;
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_address, &work_script, &work_fedpeg_script);
  return result;
}